

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvui.h
# Opt level: O0

bool cvui::mouse(String *theWindowName,int theButton,int theQuery)

{
  bool bVar1;
  cvui_context_t *pcVar2;
  bool aRet;
  cvui_mouse_btn_t *aButton;
  allocator<char> local_39;
  string local_38;
  int local_18;
  int local_14;
  int theQuery_local;
  int theButton_local;
  String *theWindowName_local;
  
  local_18 = theQuery;
  local_14 = theButton;
  _theQuery_local = theWindowName;
  if (((theButton != 2) && (theButton != 1)) && (theButton != 0)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_38,
               "Invalid mouse button. Are you using one of the available: cvui::{RIGHT,MIDDLE,LEFT}_BUTTON ?"
               ,&local_39);
    internal::error(6,&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    std::allocator<char>::~allocator(&local_39);
  }
  pcVar2 = internal::getContext(_theQuery_local);
  bVar1 = internal::isMouseButton((pcVar2->mouse).buttons + local_14,local_18);
  return bVar1;
}

Assistant:

bool mouse(const cv::String& theWindowName, int theButton, int theQuery) {
	if (theButton != RIGHT_BUTTON && theButton != MIDDLE_BUTTON && theButton != LEFT_BUTTON) {
		internal::error(6, "Invalid mouse button. Are you using one of the available: cvui::{RIGHT,MIDDLE,LEFT}_BUTTON ?");
	}

	cvui_mouse_btn_t& aButton = internal::getContext(theWindowName).mouse.buttons[theButton];
	bool aRet = internal::isMouseButton(aButton, theQuery);

	return aRet;
}